

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O3

int run_test_udp_send_hang_loop(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_idle_t *puVar2;
  uv_loop_t *loop;
  int iVar3;
  char *pcVar4;
  uv_udp_send_t *handle;
  
  puVar2 = (uv_idle_t *)uv_default_loop();
  iVar3 = 0x5b9ad0;
  iVar1 = uv_idle_init((uv_loop_t *)puVar2,&idle_handle);
  if (iVar1 == 0) {
    pcVar4 = "192.0.2.3";
    iVar3 = 0x23a3;
    iVar1 = uv_ip4_addr("192.0.2.3",0x23a3,&addr);
    puVar2 = (uv_idle_t *)pcVar4;
    if (iVar1 != 0) goto LAB_0018820c;
    puVar2 = (uv_idle_t *)uv_default_loop();
    iVar3 = 0x5b9b58;
    iVar1 = uv_udp_init((uv_loop_t *)puVar2,&client);
    if (iVar1 != 0) goto LAB_00188211;
    buf = uv_buf_init(send_data,0x400);
    puVar2 = &idle_handle;
    iVar3 = 0x188225;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    if (iVar1 != 0) goto LAB_00188216;
    puVar2 = (uv_idle_t *)uv_default_loop();
    iVar3 = 0;
    uv_run((uv_loop_t *)puVar2,UV_RUN_DEFAULT);
    if (loop_hang_called < 0x3e9) goto LAB_0018821b;
    loop = uv_default_loop();
    uv_walk(loop,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar2 = (uv_idle_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_send_hang_loop_cold_1();
LAB_0018820c:
    run_test_udp_send_hang_loop_cold_2();
LAB_00188211:
    run_test_udp_send_hang_loop_cold_3();
LAB_00188216:
    run_test_udp_send_hang_loop_cold_4();
LAB_0018821b:
    run_test_udp_send_hang_loop_cold_5();
  }
  run_test_udp_send_hang_loop_cold_6();
  if (send_req.handle == (uv_udp_t *)0x0) {
    handle = (uv_udp_send_t *)puVar2;
    if (puVar2 != &idle_handle) goto LAB_001882c0;
    puVar2 = &idle_handle;
    iVar1 = uv_idle_stop(&idle_handle);
    handle = (uv_udp_send_t *)puVar2;
    if (iVar1 != 0) goto LAB_001882c5;
    if (999 < loop_hang_called) {
      loop_hang_called = loop_hang_called + 1;
      uv_close((uv_handle_t *)&client,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&idle_handle,(uv_close_cb)0x0);
      return extraout_EAX_00;
    }
    handle = &send_req;
    iVar3 = 0x5b9b58;
    loop_hang_called = loop_hang_called + 1;
    iVar1 = uv_udp_send(&send_req,&client,&buf,1,(sockaddr *)&addr,send_cb);
    if (iVar1 == 0) {
      return extraout_EAX;
    }
  }
  else {
    handle = (uv_udp_send_t *)send_req.handle;
    idle_cb_cold_1();
LAB_001882c0:
    idle_cb_cold_2();
LAB_001882c5:
    idle_cb_cold_3();
  }
  idle_cb_cold_4();
  if ((uv_loop_t *)handle == (uv_loop_t *)0x0) {
    send_cb_cold_5();
    puVar2 = (uv_idle_t *)handle;
LAB_0018831d:
    send_cb_cold_1();
LAB_00188322:
    send_cb_cold_2();
  }
  else {
    if ((iVar3 != -0x65) && (iVar3 != 0)) goto LAB_0018832c;
    puVar2 = (uv_idle_t *)handle;
    if (*(uv_udp_t **)&((uv_loop_t *)handle)->backend_fd != &client) goto LAB_0018831d;
    if (handle != &send_req) goto LAB_00188322;
    send_req.handle = (uv_udp_t *)0x0;
    puVar2 = &idle_handle;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    if (iVar1 == 0) {
      return extraout_EAX_01;
    }
  }
  send_cb_cold_3();
  handle = (uv_udp_send_t *)puVar2;
LAB_0018832c:
  send_cb_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(udp_send_hang_loop) {
  ASSERT(0 == uv_idle_init(uv_default_loop(), &idle_handle));

  /* 192.0.2.0/8 is "TEST-NET" and reserved for documentation.
   * Good for us, though. Since we want to have something unreachable.
   */
  ASSERT(0 == uv_ip4_addr("192.0.2.3", TEST_PORT, &addr));

  ASSERT(0 == uv_udp_init(uv_default_loop(), &client));

  buf = uv_buf_init(send_data, sizeof(send_data));

  ASSERT(0 == uv_idle_start(&idle_handle, idle_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(loop_hang_called > 1000);

  MAKE_VALGRIND_HAPPY();
  return 0;
}